

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O2

void __thiscall wabt::WriteUint128(wabt *this,char *buffer,size_t size,v128 bits)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  wabt *pwVar8;
  uint data;
  int iVar9;
  int lane;
  v128 bits_local;
  char reversed_buffer [40];
  char remainder_buffer [21];
  
  bits_local.v._8_8_ = bits.v._0_8_;
  pcVar5 = (char *)0x0;
  bits_local.v._0_8_ = size;
  while( true ) {
    uVar7 = (ulong)bits_local.v._8_8_ >> 0x20;
    lane = 3;
    for (iVar9 = -3; data = (uint)(uVar7 / 10), iVar9 != 0; iVar9 = iVar9 + 1) {
      uVar3 = v128::To<unsigned_int>(&bits_local,lane + -1);
      uVar7 = CONCAT44((int)uVar7 + data * -10,uVar3);
      v128::From<unsigned_int>(&bits_local,lane,data);
      lane = lane + -1;
    }
    bits_local.v[0] = (char)data;
    bits_local.v[1] = (char)(data >> 8);
    bits_local.v[2] = (char)(data >> 0x10);
    bits_local.v[3] = (char)(data >> 0x18);
    snprintf(remainder_buffer,0x15,"%lu",uVar7 % 10);
    sVar4 = strlen(remainder_buffer);
    pcVar1 = pcVar5 + (int)sVar4;
    if ((char *)0x27 < pcVar1) break;
    memcpy(reversed_buffer + (long)pcVar5,remainder_buffer,(long)(int)sVar4);
    bVar2 = v128::is_zero(&bits_local);
    pcVar5 = pcVar1;
    if (bVar2) {
      pcVar5 = (char *)0x0;
      if (buffer <= pcVar1) {
        pcVar5 = pcVar1 + (1 - (long)buffer);
        pcVar1 = buffer + -1;
      }
      pwVar8 = this;
      for (pcVar6 = pcVar1; pcVar6 != (char *)0x0; pcVar6 = pcVar6 + -1) {
        *pwVar8 = *(wabt *)(pcVar5 + 0xf + (long)bits_local.v + (long)pcVar6);
        pwVar8 = pwVar8 + 1;
      }
      this[(long)pcVar1] = (wabt)0x0;
      return;
    }
  }
  __assert_fail("len + remainder_buffer_len < sizeof(reversed_buffer)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/literal.cc"
                ,0x32f,"void wabt::WriteUint128(char *, size_t, v128)");
}

Assistant:

void WriteUint128(char* buffer, size_t size, v128 bits) {
  uint64_t digits;
  uint64_t remainder;
  char reversed_buffer[40];
  size_t len = 0;
  do {
    remainder = bits.u32(3);

    for (int i = 3; i != 0; --i) {
      digits = remainder / 10;
      remainder = ((remainder - digits * 10) << 32) + bits.u32(i-1);
      bits.set_u32(i, digits);
    }

    digits = remainder / 10;
    remainder = remainder - digits * 10;
    bits.set_u32(0, digits);

    char remainder_buffer[21];
    snprintf(remainder_buffer, 21, "%" PRIu64, remainder);
    int remainder_buffer_len = strlen(remainder_buffer);
    assert(len + remainder_buffer_len < sizeof(reversed_buffer));
    memcpy(&reversed_buffer[len], remainder_buffer, remainder_buffer_len);
    len += remainder_buffer_len;
  } while (!bits.is_zero());
  size_t truncated_tail = 0;
  if (len >= size) {
    truncated_tail = len - size + 1;
    len = size - 1;
  }
  std::reverse_copy(reversed_buffer + truncated_tail,
                    reversed_buffer + len + truncated_tail,
                    buffer);
  buffer[len] = '\0';
}